

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldBase::MapBegin(MapFieldBase *this,MapIterator *map_iter)

{
  UntypedMapBase *this_00;
  UntypedMapIterator local_30;
  MapIterator *local_18;
  MapIterator *map_iter_local;
  MapFieldBase *this_local;
  
  local_18 = map_iter;
  map_iter_local = (MapIterator *)this;
  this_00 = MapFieldBaseForParse::GetMap(&this->super_MapFieldBaseForParse);
  UntypedMapBase::begin(&local_30,this_00);
  (local_18->iter_).node_ = local_30.node_;
  (local_18->iter_).m_ = local_30.m_;
  (local_18->iter_).bucket_index_ = local_30.bucket_index_;
  *(undefined4 *)&(local_18->iter_).field_0x14 = local_30._20_4_;
  SetMapIteratorValue(this,local_18);
  return;
}

Assistant:

void MapFieldBase::MapBegin(MapIterator* map_iter) const {
  map_iter->iter_ = GetMap().begin();
  SetMapIteratorValue(map_iter);
}